

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O2

void __thiscall cppti::HTTPController::routeTalks(HTTPController *this,Request *req,Response *res)

{
  TalksDB *this_00;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,__1L> filtertags;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  size_type sVar5;
  long lVar6;
  char *pcVar7;
  string_view speaker_00;
  string_view conference_00;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tags;
  string rawyear;
  json json;
  string_t local_d8;
  string raw_tags;
  string conference;
  string speaker;
  _Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  local_58;
  extent_type<_1L> local_40;
  pointer peStack_38;
  
  httplib::Request::get_param_value_abi_cxx11_(&speaker,req,"speaker",0);
  httplib::Request::get_param_value_abi_cxx11_(&conference,req,"conference",0);
  httplib::Request::get_param_value_abi_cxx11_(&raw_tags,req,"tags",0);
  if (raw_tags._M_string_length == 0) {
    tags.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tags.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tags.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pcVar7 = raw_tags._M_dataplus._M_p + raw_tags._M_string_length;
    tags.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tags.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tags.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rawyear._M_dataplus._M_p._0_1_ = 0x2c;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (raw_tags._M_dataplus._M_p,pcVar7);
    while (rawyear._M_dataplus._M_p = raw_tags._M_dataplus._M_p, pcVar2 != pcVar7) {
      local_d8._M_dataplus._M_p = pcVar2 + -(long)raw_tags._M_dataplus._M_p;
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<char_const*,long>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&tags,(char **)&rawyear,(long *)&local_d8);
      raw_tags._M_dataplus._M_p = pcVar2 + 1;
      rawyear._M_dataplus._M_p._0_1_ = 0x2c;
      pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (raw_tags._M_dataplus._M_p,pcVar7,&rawyear);
    }
    local_d8._M_dataplus._M_p = pcVar7 + -(long)raw_tags._M_dataplus._M_p;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<char_const*,long>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&tags,(char **)&rawyear,(long *)&local_d8);
  }
  httplib::Request::get_param_value_abi_cxx11_(&rawyear,req,"year",0);
  poVar3 = std::operator<<((ostream *)&std::cout,"speaker=\'");
  poVar3 = std::operator<<(poVar3,(string *)&speaker);
  poVar3 = std::operator<<(poVar3,"\', conference=\'");
  poVar3 = std::operator<<(poVar3,(string *)&conference);
  poVar3 = std::operator<<(poVar3,"\', tags=\'");
  poVar3 = std::operator<<(poVar3,(string *)&raw_tags);
  poVar3 = std::operator<<(poVar3,"\', year=");
  poVar3 = std::operator<<(poVar3,(string *)&rawyear);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar2 = rawyear._M_dataplus._M_p + 1;
  sVar5 = rawyear._M_string_length;
  for (lVar6 = (long)rawyear._M_string_length >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((int)pcVar2[-1] - 0x3aU < 0xfffffff6) {
      pcVar2 = pcVar2 + -1;
      goto LAB_001500b1;
    }
    if ((int)*pcVar2 - 0x3aU < 0xfffffff6) goto LAB_001500b1;
    if ((int)pcVar2[1] - 0x3aU < 0xfffffff6) {
      pcVar2 = pcVar2 + 1;
      goto LAB_001500b1;
    }
    if ((int)pcVar2[2] - 0x3aU < 0xfffffff6) {
      pcVar2 = pcVar2 + 2;
      goto LAB_001500b1;
    }
    pcVar2 = pcVar2 + 4;
    sVar5 = sVar5 - 4;
  }
  pcVar7 = pcVar2 + -1;
  if (sVar5 == 1) {
LAB_00150220:
    pcVar2 = pcVar7;
    if (0xfffffff5 < (int)*pcVar7 - 0x3aU) {
      pcVar2 = rawyear._M_dataplus._M_p + rawyear._M_string_length;
    }
LAB_001500b1:
    if (pcVar2 != rawyear._M_dataplus._M_p + rawyear._M_string_length) goto LAB_001501af;
  }
  else {
    if (sVar5 == 3) {
      pcVar4 = pcVar2;
      pcVar2 = pcVar7;
      if (0xfffffff5 < (int)*pcVar7 - 0x3aU) goto LAB_0015020b;
      goto LAB_001500b1;
    }
    pcVar4 = pcVar7;
    if (sVar5 == 2) {
LAB_0015020b:
      pcVar2 = pcVar4;
      if (0xfffffff5 < (int)*pcVar4 - 0x3aU) {
        pcVar7 = pcVar4 + 1;
        goto LAB_00150220;
      }
      goto LAB_001500b1;
    }
  }
  if (rawyear._M_string_length == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = std::__cxx11::stoi(&rawyear,(size_t *)0x0,10);
  }
  this_00 = (this->talksdb)._M_data;
  gsl::span<std::basic_string_view<char,std::char_traits<char>>const,-1l>::
  span<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,void>
            ((span<std::basic_string_view<char,std::char_traits<char>>const,_1l> *)&local_40,&tags);
  filtertags.storage_.data_ = peStack_38;
  filtertags.storage_.super_extent_type<_1L>.size_ = local_40.size_;
  speaker_00._M_str = speaker._M_dataplus._M_p;
  speaker_00._M_len = speaker._M_string_length;
  conference_00._M_str = conference._M_dataplus._M_p;
  conference_00._M_len = conference._M_string_length;
  TalksDB::get((vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                *)&local_58,this_00,speaker_00,conference_00,filtertags,(long)iVar1,0x32);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_&,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_0>
            (&json,(vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                    *)&local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_d8,&json,-1,' ',false,strict);
  httplib::Response::set_content(res,&local_d8,"application/json");
  std::__cxx11::string::~string((string *)&local_d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  std::
  _Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  ::~_Vector_base(&local_58);
LAB_001501af:
  std::__cxx11::string::~string((string *)&rawyear);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&tags.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  std::__cxx11::string::~string((string *)&raw_tags);
  std::__cxx11::string::~string((string *)&conference);
  std::__cxx11::string::~string((string *)&speaker);
  return;
}

Assistant:

void HTTPController::routeTalks(Request const& req, Response& res)
{
  auto const speaker = req.get_param_value("speaker");
  auto const conference = req.get_param_value("conference");
  auto const raw_tags = req.get_param_value("tags");
  auto const tags = splitTags(raw_tags);
  auto const rawyear = req.get_param_value("year");
  std::cout << "speaker='" << speaker << "', conference='" << conference
            << "', tags='" << raw_tags << "', year=" << rawyear << std::endl;
  if (!std::all_of(rawyear.begin(), rawyear.end(), [&](char c) {
        return std::isdigit(c);
      }))
    return;
  auto const year = rawyear.empty() ? 0 : std::stoi(rawyear);
  auto const& talks = this->talksdb.get().get(speaker, conference, tags, year);

  nlohmann::json const json = talks;
  res.set_content(json.dump(), "application/json");
}